

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdKelvinFenceOffset::is_valid_val(MthdKelvinFenceOffset *this)

{
  int iVar1;
  int unk;
  MthdKelvinFenceOffset *this_local;
  
  iVar1 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (iVar1 < 6) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset == 0x20) {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffff003) == 0;
    }
    else {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffff00f) == 0;
    }
  }
  else if ((uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c) < 5) {
    if (((this->super_SingleMthdTest).super_MthdTest.val & 0xf0fff00f) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE) {
			if (chipset.chipset == 0x20)
				return !(val & ~0xffc);
			else
				return !(val & ~0xff0);
		} else {
			int unk = extr(val, 24, 4);
			if (unk > 4)
				return false;
			if (val & ~0x0f000ff0)
				return false;
			return true;
		}
	}